

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog2.hpp
# Opt level: O0

int burst::intlog2<int>(int integer)

{
  int iVar1;
  domain_error *this;
  int integer_local;
  
  if (0 < integer) {
    iVar1 = detail::intlog2_impl<int>(integer);
    return iVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_2ab9ba);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr Integer intlog2 (Integer integer)
    {
        static_assert(std::is_integral<Integer>::value, "Число должно быть целым.");

        return integer > 0
            ? detail::intlog2_impl(integer)
            : throw std::domain_error("Двоичный логарифм не определён на неположительных числах.");
    }